

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinternalmimedata.cpp
# Opt level: O3

QByteArray *
QInternalMimeData::renderDataHelper
          (QByteArray *__return_storage_ptr__,QString *mimeType,QMimeData *data)

{
  PrivateShared *pPVar1;
  Data *pDVar2;
  char *pcVar3;
  QArrayData *pQVar4;
  long lVar5;
  char cVar6;
  bool bVar7;
  ulong uVar8;
  QMetaType QVar9;
  undefined8 uVar10;
  anon_union_24_3_e3d07ef4_for_data *paVar11;
  long in_FS_OFFSET;
  float fVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  QStringView QVar15;
  QStringView QVar16;
  QLatin1String QVar17;
  QStringView QVar18;
  QLatin1String QVar19;
  QLatin1String QVar20;
  QMetaType local_a8;
  undefined1 *puStack_a0;
  undefined1 local_98 [32];
  QImage local_78;
  anon_union_24_3_e3d07ef4_for_data local_58;
  byte local_40;
  undefined7 uStack_3f;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char *)0x0;
  (__return_storage_ptr__->d).size = 0;
  if ((mimeType->d).size == 0x13) {
    QVar15.m_data = (mimeType->d).ptr;
    QVar15.m_size = 0x13;
    QVar19.m_data = "application/x-color";
    QVar19.m_size = 0x13;
    cVar6 = QtPrivate::equalStrings(QVar15,QVar19);
    if (cVar6 != '\0') {
      QByteArray::resize((longlong)__return_storage_ptr__);
      pDVar2 = (__return_storage_ptr__->d).d;
      if ((pDVar2 == (Data *)0x0) ||
         (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
        QByteArray::reallocData
                  ((longlong)__return_storage_ptr__,
                   (AllocationOption)(__return_storage_ptr__->d).size);
      }
      pcVar3 = (__return_storage_ptr__->d).ptr;
      local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      paVar11 = &local_58;
      QMimeData::colorData();
      local_a8.d_ptr = &QtPrivate::QMetaTypeInterfaceWrapper<QColor>::metaType;
      uVar8 = CONCAT71(uStack_3f,local_40) & 0xfffffffffffffffc;
      local_78.super_QPaintDevice._vptr_QPaintDevice._0_4_ = (undefined4)uVar8;
      local_78.super_QPaintDevice._vptr_QPaintDevice._4_2_ = (undefined2)(uVar8 >> 0x20);
      local_78.super_QPaintDevice._vptr_QPaintDevice._6_2_ = (undefined2)(uVar8 >> 0x30);
      bVar7 = comparesEqual((QMetaType *)&local_78,&local_a8);
      if (bVar7) {
        if ((local_40 & 1) == 0) {
          local_78.super_QPaintDevice._vptr_QPaintDevice._0_4_ = local_58._0_4_;
          uVar13 = local_58._4_4_;
          local_78.super_QPaintDevice._8_4_ = local_58._8_4_;
          uVar14 = local_58._12_4_;
        }
        else {
          pPVar1 = local_58.shared +
                   (int)*(QFlagsStorageHelper<QArrayData::ArrayOption,_4> *)(local_58.shared + 4);
          local_78.super_QPaintDevice._vptr_QPaintDevice._0_4_ = *(undefined4 *)pPVar1;
          uVar13 = *(undefined4 *)(pPVar1 + 4);
          local_78.super_QPaintDevice._8_4_ = *(undefined4 *)(pPVar1 + 8);
          uVar14 = *(undefined4 *)(pPVar1 + 0xc);
        }
        local_78.super_QPaintDevice._vptr_QPaintDevice._4_2_ = (undefined2)uVar13;
        local_78.super_QPaintDevice._vptr_QPaintDevice._6_2_ = (undefined2)((uint)uVar13 >> 0x10);
        local_78.super_QPaintDevice._12_2_ = SUB42(uVar14,0);
        local_78.super_QPaintDevice._14_2_ = SUB42((uint)uVar14 >> 0x10,0);
      }
      else {
        local_78.super_QPaintDevice._14_2_ = 0xaaaa;
        local_78.super_QPaintDevice._vptr_QPaintDevice._0_4_ = 0;
        local_78.super_QPaintDevice._vptr_QPaintDevice._4_2_ = 0xffff;
        local_78.super_QPaintDevice._vptr_QPaintDevice._6_2_ = 0;
        local_78.super_QPaintDevice.painters = 0;
        local_78.super_QPaintDevice._10_2_ = 0;
        local_78.super_QPaintDevice._12_2_ = 0;
        QVar9.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
        if ((local_40 & 1) != 0) {
          paVar11 = (anon_union_24_3_e3d07ef4_for_data *)
                    (local_58.shared +
                    (int)*(QFlagsStorageHelper<QArrayData::ArrayOption,_4> *)(local_58.shared + 4));
        }
        QMetaType::convert(QVar9,paVar11,local_a8,&local_78);
      }
      local_98._0_8_ =
           CONCAT26(local_78.super_QPaintDevice._vptr_QPaintDevice._6_2_,
                    CONCAT24(local_78.super_QPaintDevice._vptr_QPaintDevice._4_2_,
                             local_78.super_QPaintDevice._vptr_QPaintDevice._0_4_));
      local_98._12_2_ = local_78.super_QPaintDevice._12_2_;
      local_98._8_2_ = local_78.super_QPaintDevice.painters;
      local_98._10_2_ = local_78.super_QPaintDevice._10_2_;
      ::QVariant::~QVariant((QVariant *)&local_58);
      fVar12 = QColor::redF((QColor *)local_98);
      *(short *)pcVar3 = (short)(int)(fVar12 * 65535.0);
      fVar12 = QColor::greenF((QColor *)local_98);
      *(short *)(pcVar3 + 2) = (short)(int)(fVar12 * 65535.0);
      fVar12 = QColor::blueF((QColor *)local_98);
      *(short *)(pcVar3 + 4) = (short)(int)(fVar12 * 65535.0);
      fVar12 = QColor::alphaF((QColor *)local_98);
      *(short *)(pcVar3 + 6) = (short)(int)(fVar12 * 65535.0);
      goto LAB_002ebd6b;
    }
  }
  QMimeData::data((QString *)local_58.data);
  pQVar4 = &((__return_storage_ptr__->d).d)->super_QArrayData;
  pcVar3 = (__return_storage_ptr__->d).ptr;
  (__return_storage_ptr__->d).d = (Data *)local_58.shared;
  (__return_storage_ptr__->d).ptr = (char *)local_58._8_8_;
  lVar5 = (__return_storage_ptr__->d).size;
  (__return_storage_ptr__->d).size = local_58._16_8_;
  uVar10 = local_58._16_8_;
  local_58.shared = (PrivateShared *)pQVar4;
  local_58._8_8_ = pcVar3;
  local_58._16_8_ = lVar5;
  if (pQVar4 != (QArrayData *)0x0) {
    LOCK();
    (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar4,1,0x10);
    }
    uVar10 = (__return_storage_ptr__->d).size;
  }
  if (uVar10 != 0) goto LAB_002ebd6b;
  if ((mimeType->d).size == 0x16) {
    QVar16.m_data = (mimeType->d).ptr;
    QVar16.m_size = 0x16;
    QVar20.m_data = "application/x-qt-image";
    QVar20.m_size = 0x16;
    cVar6 = QtPrivate::equalStrings(QVar16,QVar20);
    if (cVar6 == '\0') goto LAB_002ebb30;
    cVar6 = QMimeData::hasImage();
    if (cVar6 == '\0') goto LAB_002ebb30;
    local_78.d = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
    local_78.super_QPaintDevice._vptr_QPaintDevice._0_4_ = 0xaaaaaaaa;
    local_78.super_QPaintDevice._vptr_QPaintDevice._4_2_ = 0xaaaa;
    local_78.super_QPaintDevice._vptr_QPaintDevice._6_2_ = 0xaaaa;
    local_78.super_QPaintDevice.painters = 0xaaaa;
    local_78.super_QPaintDevice._10_2_ = 0xaaaa;
    local_78.super_QPaintDevice._12_2_ = 0xaaaa;
    local_78.super_QPaintDevice._14_2_ = 0xaaaa;
    QMimeData::imageData();
    qvariant_cast<QImage>(&local_78,(QVariant *)&local_58);
    ::QVariant::~QVariant((QVariant *)&local_58);
    local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QBuffer::QBuffer((QBuffer *)local_58.data,__return_storage_ptr__,(QObject *)0x0);
    QBuffer::open(&local_58,2);
    QImage::save(&local_78,(QIODevice *)local_58.data,"PNG",-1);
    QBuffer::~QBuffer((QBuffer *)local_58.data);
  }
  else {
LAB_002ebb30:
    QVar17.m_data = &DAT_00000006;
    QVar17.m_size = (qsizetype)mimeType;
    cVar6 = QString::startsWith(QVar17,0x679058);
    if (cVar6 == '\0') goto LAB_002ebd6b;
    cVar6 = QMimeData::hasImage();
    if (cVar6 == '\0') goto LAB_002ebd6b;
    local_78.d = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
    local_78.super_QPaintDevice._vptr_QPaintDevice._0_4_ = 0xaaaaaaaa;
    local_78.super_QPaintDevice._vptr_QPaintDevice._4_2_ = 0xaaaa;
    local_78.super_QPaintDevice._vptr_QPaintDevice._6_2_ = 0xaaaa;
    local_78.super_QPaintDevice.painters = 0xaaaa;
    local_78.super_QPaintDevice._10_2_ = 0xaaaa;
    local_78.super_QPaintDevice._12_2_ = 0xaaaa;
    local_78.super_QPaintDevice._14_2_ = 0xaaaa;
    QMimeData::imageData();
    qvariant_cast<QImage>(&local_78,(QVariant *)&local_58);
    ::QVariant::~QVariant((QVariant *)&local_58);
    local_a8.d_ptr = (QMetaTypeInterface *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
    QBuffer::QBuffer((QBuffer *)&local_a8,__return_storage_ptr__,(QObject *)0x0);
    QBuffer::open(&local_a8,2);
    QVar18.m_data = (storage_type_conflict *)((mimeType->d).size + -6);
    QVar18.m_size = (qsizetype)local_98;
    QtPrivate::convertToLatin1(QVar18);
    QByteArray::toUpper_helper((QByteArray *)&local_58);
    uVar10 = local_58._8_8_;
    if ((char *)local_58._8_8_ == (char *)0x0) {
      uVar10 = &QByteArray::_empty;
    }
    QImage::save(&local_78,(QIODevice *)&local_a8,(char *)uVar10,-1);
    if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_58.shared = *(int *)local_58.shared + -1;
      UNLOCK();
      if (*(int *)local_58.shared == 0) {
        QArrayData::deallocate((QArrayData *)local_58.shared,1,0x10);
      }
    }
    if ((QArrayData *)local_98._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_98._0_8_,1,0x10);
      }
    }
    QBuffer::~QBuffer((QBuffer *)&local_a8);
  }
  QImage::~QImage(&local_78);
LAB_002ebd6b:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray QInternalMimeData::renderDataHelper(const QString &mimeType, const QMimeData *data)
{
    QByteArray ba;
    if (mimeType == "application/x-color"_L1) {
        /* QMimeData can only provide colors as QColor or the name
           of a color as a QByteArray or a QString. So we need to do
           the conversion to application/x-color here.
           The application/x-color format is :
           type: application/x-color
           format: 16
           data[0]: red
           data[1]: green
           data[2]: blue
           data[3]: opacity
        */
        ba.resize(8);
        ushort * colBuf = (ushort *)ba.data();
        QColor c = qvariant_cast<QColor>(data->colorData());
        colBuf[0] = ushort(c.redF() * 0xFFFF);
        colBuf[1] = ushort(c.greenF() * 0xFFFF);
        colBuf[2] = ushort(c.blueF() * 0xFFFF);
        colBuf[3] = ushort(c.alphaF() * 0xFFFF);
    } else {
        ba = data->data(mimeType);
        if (ba.isEmpty()) {
            if (mimeType == "application/x-qt-image"_L1 && data->hasImage()) {
                QImage image = qvariant_cast<QImage>(data->imageData());
                QBuffer buf(&ba);
                buf.open(QBuffer::WriteOnly);
                // would there not be PNG ??
                image.save(&buf, "PNG");
            } else if (auto prefix = "image/"_L1; mimeType.startsWith(prefix) && data->hasImage()) {
                QImage image = qvariant_cast<QImage>(data->imageData());
                QBuffer buf(&ba);
                buf.open(QBuffer::WriteOnly);
                auto type = QStringView{mimeType}.sliced(prefix.size());
                image.save(&buf, type.toLatin1().toUpper().constData());
            }
        }
    }
    return ba;
}